

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pl_Function.cc
# Opt level: O2

void __thiscall Pl_Function::~Pl_Function(Pl_Function *this)

{
  (this->super_Pipeline)._vptr_Pipeline = (_func_int **)&PTR__Pl_Function_002ac510;
  std::unique_ptr<Pl_Function::Members,_std::default_delete<Pl_Function::Members>_>::~unique_ptr
            (&this->m);
  Pipeline::~Pipeline(&this->super_Pipeline);
  return;
}

Assistant:

Pl_Function::~Pl_Function() // NOLINT (modernize-use-equals-default)
{
    // Must be explicit and not inline -- see QPDF_DLL_CLASS in README-maintainer
}